

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void __thiscall amrex::MLABecLaplacian::applyRobinBCTermsCoeffs(MLABecLaplacian *this)

{
  double dVar1;
  double dVar2;
  int iVar3;
  FabArray<amrex::FArrayBox> *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  IntVect hi;
  IntVect low;
  Real fac;
  Real fac_1;
  Real fac_2;
  MFIter mfi;
  bool local_36c;
  long local_368;
  long local_350;
  int local_328 [4];
  int local_318 [4];
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  ulong local_2a0;
  ulong local_298;
  long local_290;
  ulong local_288;
  ulong local_280;
  long local_278;
  uint local_26c;
  Array4<const_double> local_268;
  Array4<double> local_228;
  long local_1e8;
  ulong local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  int local_1b0;
  uint local_1ac;
  int local_1a8;
  int local_1a4;
  long local_1a0;
  double local_198;
  double local_190;
  double local_188;
  MLABecLaplacian *local_180;
  long local_178;
  long local_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  double dStack_140;
  MFItInfo local_134;
  double local_120;
  double local_118;
  long local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  LinOpBCType *local_f0;
  LinOpBCType *local_e8;
  long local_e0;
  long local_d0;
  long local_c8;
  long local_c0;
  ulong local_b8;
  uint local_b0;
  Box local_ac;
  MFIter local_90;
  
  bVar10 = MLLinOp::hasRobinBC((MLLinOp *)this);
  if (bVar10) {
    local_26c = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])
                          (this);
    local_118 = this->m_a_scalar;
    local_120 = local_118;
    if ((local_118 == 0.0) && (!NAN(local_118))) {
      this->m_a_scalar = 1.0;
      local_120 = 1.0;
    }
    if (0 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels) {
      local_120 = this->m_b_scalar / local_120;
      local_f8 = (ulong)local_26c;
      lVar17 = 0;
      local_180 = this;
      do {
        lVar33 = lVar17 * 3;
        lVar28 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar17].
                           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
        local_148 = *(double *)(lVar28 + 0x38);
        dStack_140 = 0.0;
        local_158 = *(double *)(lVar28 + 0x40);
        dStack_150 = 0.0;
        local_168 = *(double *)(lVar28 + 0x48);
        dStack_160 = 0.0;
        local_1a0 = lVar17;
        if ((local_118 == 0.0) && (!NAN(local_118))) {
          this_00 = *(FabArray<amrex::FArrayBox> **)
                     &(this->m_a_coeffs).
                      super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar17].
                      super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                      super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
          FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (this_00,0.0,0,(this_00->super_FabArrayBase).n_comp,
                     &(this_00->super_FabArrayBase).n_grow);
        }
        local_134.do_tiling = false;
        local_134.dynamic = true;
        local_134.device_sync = true;
        local_134.num_streams = Gpu::Device::max_gpu_streams;
        local_134.tilesize.vect[0] = 0;
        local_134.tilesize.vect[1] = 0;
        local_134.tilesize.vect[2] = 0;
        MFIter::MFIter(&local_90,
                       *(FabArrayBase **)
                        &(this->m_a_coeffs).
                         super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar17].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
                       &local_134);
        if (local_90.currentIndex < local_90.endIndex) {
          local_188 = local_120 * local_158 * local_158;
          local_190 = local_120 * local_148 * local_148;
          local_198 = local_120 * local_168 * local_168;
          dStack_150 = local_158;
          dStack_140 = local_148;
          dStack_160 = local_168;
          local_110 = lVar28;
          local_108 = lVar33;
          do {
            BATransformer::operator()
                      (&local_ac,&((local_90.fabArray)->boxarray).m_bat,
                       (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>)
                                     .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c
                              + *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                            super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->m_abox).
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data));
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_228,
                       &(&(((this->m_a_coeffs).
                            super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>).
                          super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                          _M_impl.super__Vector_impl_data._M_start)[lVar33]->
                        super_FabArray<amrex::FArrayBox>,&local_90);
            lVar17 = lVar28;
            lVar12 = 0;
            do {
              lVar30 = lVar12;
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_268,
                         &(&(((this->m_b_coeffs).
                              super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)[lVar33]->_M_elems[lVar30].
                          super_FabArray<amrex::FArrayBox>,&local_90);
              lVar33 = local_108;
              lVar28 = local_110;
              this = local_180;
              local_318[2] = local_ac.smallend.vect[2];
              local_318[0] = local_ac.smallend.vect[0];
              local_318[1] = local_ac.smallend.vect[1];
              local_328[2] = local_ac.bigend.vect[2];
              local_328[0] = local_ac.bigend.vect[0];
              local_328[1] = local_ac.bigend.vect[1];
              iVar3 = local_318[lVar30];
              local_318[lVar30] = iVar3 + -1;
              iVar9 = local_318[2];
              local_328[lVar30] = iVar3 + -1;
              iVar6 = local_328[2];
              iVar7 = local_318[0];
              lVar21 = (long)local_318[0];
              iVar8 = local_318[1];
              lVar22 = (long)local_318[1];
              lVar15 = (long)local_318[2];
              iVar3 = local_328[0];
              iVar5 = local_328[1];
              local_280 = (ulong)(uint)local_328[1];
              local_298 = (ulong)(uint)local_328[2];
              local_318[2] = local_ac.smallend.vect[2];
              local_318[0] = local_ac.smallend.vect[0];
              local_318[1] = local_ac.smallend.vect[1];
              local_328[2] = local_ac.bigend.vect[2];
              local_328[0] = local_ac.bigend.vect[0];
              local_328[1] = local_ac.bigend.vect[1];
              local_b8 = CONCAT44(local_ac.btype.itype >> 1,local_ac.btype.itype) & 0x100000001;
              local_b0 = local_ac.btype.itype >> 2 & 1;
              iVar11 = (~*(uint *)((long)&local_b8 + lVar30 * 4) & 1) + local_328[lVar30];
              local_318[lVar30] = iVar11;
              local_328[lVar30] = iVar11;
              local_278 = (long)local_318[0];
              lVar12 = (long)local_318[1];
              lVar13 = (long)local_318[2];
              local_288 = (ulong)(uint)local_328[1];
              local_2a0 = (ulong)(uint)local_328[2];
              if (iVar7 < *(int *)(lVar17 + 0xac)) {
                local_36c = false;
              }
              else if ((((iVar8 < *(int *)(lVar17 + 0xb0)) || (iVar9 < *(int *)(lVar17 + 0xb4))) ||
                       (*(int *)(lVar17 + 0xb8) < iVar3)) || (*(int *)(lVar17 + 0xbc) < iVar5)) {
                local_36c = false;
              }
              else {
                local_36c = iVar6 <= *(int *)(lVar17 + 0xc0);
              }
              if (local_318[0] < *(int *)(lVar17 + 0xac)) {
                local_1ac = 0;
              }
              else if (((local_318[1] < *(int *)(lVar17 + 0xb0)) ||
                       (local_318[2] < *(int *)(lVar17 + 0xb4))) ||
                      ((*(int *)(lVar17 + 0xb8) < local_328[0] ||
                       (*(int *)(lVar17 + 0xbc) < local_328[1])))) {
                local_1ac = 0;
              }
              else {
                local_1ac = (uint)(local_328[2] <= *(int *)(lVar17 + 0xc0));
              }
              if ((local_36c & (byte)local_1ac) == 0 && 0 < (int)local_26c) {
                local_e0 = *(long *)((long)(local_180->super_MLCellABecLap).super_MLCellLinOp.
                                           m_robin_bcval.
                                           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                           .
                                           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[local_1a0]._M_t
                                           .
                                           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                    + 0x108);
                local_f0 = ((local_180->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                            m_lobc_orig.
                            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30;
                local_e8 = ((local_180->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.
                            m_hibc_orig.
                            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            .
                            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar30;
                local_2d4 = iVar5 + 1;
                local_2dc = iVar6 + 1;
                local_2d8 = local_328[1] + 1;
                local_2e0 = local_328[2] + 1;
                local_2f8 = lVar21 * 8;
                local_170 = lVar15 * 8;
                iVar11 = (iVar3 - iVar7) + 1;
                local_178 = lVar22 * 8;
                local_2a8 = local_278 * 8;
                iVar32 = (local_328[0] - local_318[0]) + 1;
                local_100 = (long)local_90.currentIndex * 4;
                local_1c8 = lVar12 * 8;
                local_1d0 = lVar13 * 8;
                local_1a4 = local_318[1] + -1;
                local_1a8 = local_318[0] + -1;
                local_1b0 = local_318[2] + -1;
                local_300 = 8;
                local_308 = 0;
                local_2f0 = 0;
                local_1e0 = 0;
                do {
                  piVar14 = &local_90.currentIndex;
                  if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                    piVar14 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + local_90.currentIndex;
                  }
                  lVar17 = *(long *)(local_e0 + (long)*piVar14 * 8);
                  local_2b8 = *(long *)(lVar17 + 0x10);
                  local_2c0 = (long)*(int *)(lVar17 + 0x18);
                  local_2c8 = (long)*(int *)(lVar17 + 0x1c);
                  local_2d0 = (long)*(int *)(lVar17 + 0x20);
                  lVar29 = (long)((*(int *)(lVar17 + 0x24) - *(int *)(lVar17 + 0x18)) + 1);
                  local_2b0 = (long)((*(int *)(lVar17 + 0x28) - *(int *)(lVar17 + 0x1c)) + 1);
                  lVar17 = (long)((*(int *)(lVar17 + 0x2c) - *(int *)(lVar17 + 0x20)) + 1);
                  local_d0 = local_1e0 * 3;
                  iVar25 = (int)lVar30;
                  if (local_f0[local_1e0 * 3] == Robin && local_36c == false) {
                    if (iVar25 == 1) {
                      if (iVar9 <= iVar6) {
                        lVar16 = local_2b8 + local_2f8 + local_2c0 * -8;
                        local_1b8 = local_2b0 * lVar29 * 8;
                        local_2e8 = (local_308 * lVar17 + local_170 + local_2d0 * -8) * local_2b0 +
                                    local_2c8 * -8;
                        local_290 = lVar15;
                        do {
                          if (iVar8 <= iVar5) {
                            local_c0 = (long)local_228.begin.x;
                            local_1c0 = (long)local_228.begin.y;
                            local_c8 = (long)local_228.begin.z;
                            lVar27 = lVar22;
                            do {
                              if (iVar7 <= iVar3) {
                                lVar31 = ((lVar27 - local_1c0) + 1) * local_228.jstride * 8 +
                                         local_228.nstride * local_2f0 +
                                         (local_290 - local_c8) * local_228.kstride * 8 +
                                         local_c0 * -8 + local_2f8;
                                lVar20 = 0;
                                do {
                                  dVar1 = *(double *)
                                           ((local_2e8 + lVar27 * 8) * lVar29 + lVar16 + lVar20 * 8)
                                  ;
                                  dVar2 = *(double *)
                                           (((local_300 * lVar17 + local_170 + local_2d0 * -8) *
                                             local_2b0 + local_2c8 * -8 + lVar27 * 8) * lVar29 +
                                            lVar16 + lVar20 * 8);
                                  *(double *)((long)local_228.p + lVar20 * 8 + lVar31) =
                                       (1.0 - (dVar2 * local_158 + dVar1 * -0.5) /
                                              (dVar2 * dStack_150 + dVar1 * 0.5)) *
                                       *(double *)
                                        ((long)local_268.p +
                                        lVar20 * 8 +
                                        ((lVar27 - local_268.begin.y) + 1) * local_268.jstride * 8 +
                                        local_268.nstride * local_2f0 +
                                        (local_290 - local_268.begin.z) * local_268.kstride * 8 +
                                        (long)local_268.begin.x * -8 + local_2f8) * local_188 +
                                       *(double *)((long)local_228.p + lVar20 * 8 + lVar31);
                                  lVar20 = lVar20 + 1;
                                } while (iVar11 != (int)lVar20);
                              }
                              iVar4 = (int)lVar27;
                              lVar27 = lVar27 + 1;
                            } while (local_2d4 != iVar4 + 1);
                          }
                          local_290 = local_290 + 1;
                          lVar16 = lVar16 + local_1b8;
                        } while (local_2dc != (int)local_290);
                      }
                    }
                    else if (iVar25 == 0) {
                      if (iVar9 <= iVar6) {
                        local_368 = ((local_300 * lVar17 + local_170 + local_2d0 * -8) * local_2b0 +
                                     local_178 + local_2c8 * -8) * lVar29 + local_2c0 * -8 +
                                    local_2f8 + local_2b8;
                        lVar31 = local_2b0 * lVar29 * 8;
                        lVar27 = ((local_308 * lVar17 + local_170 + local_2d0 * -8) * local_2b0 +
                                  local_178 + local_2c8 * -8) * lVar29 + local_2c0 * -8 +
                                 local_2f8 + local_2b8;
                        lVar16 = lVar15;
                        do {
                          if (iVar8 <= iVar5) {
                            local_2e8 = (long)local_268.begin.x;
                            lVar24 = (long)local_228.p +
                                     local_228.nstride * local_2f0 +
                                     (lVar22 - local_228.begin.y) * local_228.jstride * 8 +
                                     (lVar16 - local_228.begin.z) * local_228.kstride * 8 +
                                     (long)local_228.begin.x * -8 + local_2f8 + 8;
                            lVar23 = (long)local_268.p +
                                     local_268.nstride * local_2f0 +
                                     (lVar22 - local_268.begin.y) * local_268.jstride * 8 +
                                     (lVar16 - local_268.begin.z) * local_268.kstride * 8 +
                                     local_2e8 * -8 + local_2f8 + 8;
                            lVar20 = lVar27;
                            lVar26 = local_368;
                            lVar18 = lVar22;
                            do {
                              if (iVar7 <= iVar3) {
                                lVar19 = 0;
                                do {
                                  dVar1 = *(double *)(lVar20 + lVar19 * 8);
                                  dVar2 = *(double *)(lVar26 + lVar19 * 8);
                                  *(double *)(lVar24 + lVar19 * 8) =
                                       (1.0 - (dVar2 * local_148 + dVar1 * -0.5) /
                                              (dVar2 * dStack_140 + dVar1 * 0.5)) *
                                       *(double *)(lVar23 + lVar19 * 8) * local_190 +
                                       *(double *)(lVar24 + lVar19 * 8);
                                  lVar19 = lVar19 + 1;
                                } while (iVar11 != (int)lVar19);
                              }
                              lVar18 = lVar18 + 1;
                              lVar26 = lVar26 + lVar29 * 8;
                              lVar20 = lVar20 + lVar29 * 8;
                              lVar24 = lVar24 + local_228.jstride * 8;
                              lVar23 = lVar23 + local_268.jstride * 8;
                            } while (local_2d4 != (int)lVar18);
                          }
                          lVar16 = lVar16 + 1;
                          local_368 = local_368 + lVar31;
                          lVar27 = lVar27 + lVar31;
                        } while (local_2dc != (int)lVar16);
                      }
                    }
                    else if (iVar9 <= iVar6) {
                      local_2e8 = local_2b8 + local_2f8 + local_2c0 * -8;
                      local_290 = local_178 + local_2c8 * -8;
                      local_1b8 = local_300 * lVar17 + local_2d0 * -8;
                      local_1c0 = local_308 * lVar17 + local_2d0 * -8;
                      lVar16 = lVar15;
                      do {
                        if (iVar8 <= iVar5) {
                          lVar26 = (long)local_268.p +
                                   local_268.nstride * local_2f0 +
                                   (lVar22 - local_268.begin.y) * local_268.jstride * 8 +
                                   ((lVar16 - local_268.begin.z) + 1) * local_268.kstride * 8 +
                                   (long)local_268.begin.x * -8 + local_2f8;
                          lVar18 = ((local_1b8 + lVar16 * 8) * local_2b0 + local_290) * lVar29 +
                                   local_2e8;
                          lVar31 = ((lVar16 * 8 + local_1c0) * local_2b0 + local_290) * lVar29 +
                                   local_2e8;
                          lVar20 = (long)local_228.p +
                                   local_228.nstride * local_2f0 +
                                   (lVar22 - local_228.begin.y) * local_228.jstride * 8 +
                                   ((lVar16 - local_228.begin.z) + 1) * local_228.kstride * 8 +
                                   (long)local_228.begin.x * -8 + local_2f8;
                          lVar27 = lVar22;
                          do {
                            if (iVar7 <= iVar3) {
                              lVar24 = 0;
                              do {
                                dVar1 = *(double *)(lVar31 + lVar24 * 8);
                                dVar2 = *(double *)(lVar18 + lVar24 * 8);
                                *(double *)(lVar20 + lVar24 * 8) =
                                     (1.0 - (dVar2 * local_168 + dVar1 * -0.5) /
                                            (dVar2 * dStack_160 + dVar1 * 0.5)) *
                                     *(double *)(lVar26 + lVar24 * 8) * local_198 +
                                     *(double *)(lVar20 + lVar24 * 8);
                                lVar24 = lVar24 + 1;
                              } while (iVar11 != (int)lVar24);
                            }
                            lVar27 = lVar27 + 1;
                            lVar26 = lVar26 + local_268.jstride * 8;
                            lVar18 = lVar18 + lVar29 * 8;
                            lVar31 = lVar31 + lVar29 * 8;
                            lVar20 = lVar20 + local_228.jstride * 8;
                          } while (local_2d4 != (int)lVar27);
                        }
                        lVar16 = lVar16 + 1;
                      } while (local_2dc != (int)lVar16);
                    }
                  }
                  if (local_e8[local_1e0 * 3] == Robin && (byte)local_1ac == 0) {
                    if (iVar25 == 1) {
                      if (local_318[2] <= local_328[2]) {
                        lVar16 = ((local_300 * lVar17 + local_1d0 + local_2d0 * -8) * local_2b0 +
                                  local_1c8 + local_2c8 * -8) * lVar29 + local_2c0 * -8 +
                                 local_2b8 + local_2a8;
                        lVar31 = local_2b0 * lVar29 * 8;
                        lVar27 = ((lVar17 * local_308 + local_1d0 + local_2d0 * -8) * local_2b0 +
                                  local_1c8 + local_2c8 * -8) * lVar29 + local_2c0 * -8 +
                                 local_2b8 + local_2a8;
                        lVar17 = lVar13;
                        do {
                          if (local_318[1] <= local_328[1]) {
                            lVar24 = (long)local_268.p +
                                     local_268.nstride * local_2f0 +
                                     (lVar12 - local_268.begin.y) * local_268.jstride * 8 +
                                     (lVar17 - local_268.begin.z) * local_268.kstride * 8 +
                                     (long)local_268.begin.x * -8 + local_2a8;
                            iVar25 = local_1a4 - local_228.begin.y;
                            lVar20 = lVar12;
                            lVar26 = lVar27;
                            lVar18 = lVar16;
                            do {
                              if (local_318[0] <= local_328[0]) {
                                lVar23 = (long)iVar25 * local_228.jstride * 8 +
                                         local_228.nstride * local_2f0 +
                                         (lVar17 - local_228.begin.z) * local_228.kstride * 8 +
                                         (long)local_228.begin.x * -8 + local_2a8;
                                lVar19 = 0;
                                do {
                                  dVar1 = *(double *)(lVar26 + lVar19 * 8);
                                  dVar2 = *(double *)(lVar18 + lVar19 * 8);
                                  *(double *)((long)local_228.p + lVar19 * 8 + lVar23) =
                                       (1.0 - (dVar2 * local_158 + dVar1 * -0.5) /
                                              (dVar2 * dStack_150 + dVar1 * 0.5)) *
                                       *(double *)(lVar24 + lVar19 * 8) * local_188 +
                                       *(double *)((long)local_228.p + lVar19 * 8 + lVar23);
                                  lVar19 = lVar19 + 1;
                                } while (iVar32 != (int)lVar19);
                              }
                              lVar20 = lVar20 + 1;
                              lVar24 = lVar24 + local_268.jstride * 8;
                              lVar18 = lVar18 + lVar29 * 8;
                              lVar26 = lVar26 + lVar29 * 8;
                              iVar25 = iVar25 + 1;
                            } while (local_2d8 != (int)lVar20);
                          }
                          lVar17 = lVar17 + 1;
                          lVar16 = lVar16 + lVar31;
                          lVar27 = lVar27 + lVar31;
                        } while (local_2e0 != (int)lVar17);
                      }
                    }
                    else if (iVar25 == 0) {
                      if (local_318[2] <= local_328[2]) {
                        local_350 = ((local_300 * lVar17 + local_1d0 + local_2d0 * -8) * local_2b0 +
                                     local_1c8 + local_2c8 * -8) * lVar29 + local_2c0 * -8 +
                                    local_2b8 + local_2a8;
                        local_2e8 = local_2b0 * lVar29 * 8;
                        lVar17 = ((lVar17 * local_308 + local_1d0 + local_2d0 * -8) * local_2b0 +
                                  local_1c8 + local_2c8 * -8) * lVar29 + local_2c0 * -8 +
                                 local_2b8 + local_2a8;
                        local_368 = lVar13;
                        do {
                          if (local_318[1] <= local_328[1]) {
                            lVar26 = (local_368 - local_228.begin.z) * local_228.kstride;
                            lVar20 = (long)local_268.p +
                                     local_268.nstride * local_2f0 +
                                     (lVar12 - local_268.begin.y) * local_268.jstride * 8 +
                                     (local_368 - local_268.begin.z) * local_268.kstride * 8 +
                                     (long)local_268.begin.x * -8 + local_2a8;
                            lVar16 = local_350;
                            lVar27 = lVar12;
                            lVar31 = lVar17;
                            do {
                              if (local_318[0] <= local_328[0]) {
                                lVar18 = (lVar27 - local_228.begin.y) * local_228.jstride;
                                lVar24 = 0;
                                do {
                                  dVar1 = *(double *)(lVar31 + lVar24 * 8);
                                  dVar2 = *(double *)(lVar16 + lVar24 * 8);
                                  lVar23 = (long)((local_1a8 - local_228.begin.x) + (int)lVar24);
                                  local_228.p
                                  [lVar26 + local_228.nstride * local_1e0 + lVar18 + lVar23] =
                                       (1.0 - (dVar2 * local_148 + dVar1 * -0.5) /
                                              (dVar2 * dStack_140 + dVar1 * 0.5)) *
                                       *(double *)(lVar20 + lVar24 * 8) * local_190 +
                                       local_228.p
                                       [lVar26 + local_228.nstride * local_1e0 + lVar18 + lVar23];
                                  lVar24 = lVar24 + 1;
                                } while (iVar32 != (int)lVar24);
                              }
                              lVar27 = lVar27 + 1;
                              lVar20 = lVar20 + local_268.jstride * 8;
                              lVar16 = lVar16 + lVar29 * 8;
                              lVar31 = lVar31 + lVar29 * 8;
                            } while (local_2d8 != (int)lVar27);
                          }
                          local_368 = local_368 + 1;
                          local_350 = local_350 + local_2e8;
                          lVar17 = lVar17 + local_2e8;
                        } while (local_2e0 != (int)local_368);
                      }
                    }
                    else if (local_318[2] <= local_328[2]) {
                      lVar31 = ((local_300 * lVar17 + local_1d0 + local_2d0 * -8) * local_2b0 +
                                local_1c8 + local_2c8 * -8) * lVar29 + local_2c0 * -8 +
                               local_2b8 + local_2a8;
                      lVar16 = local_2b0 * lVar29 * 8;
                      lVar27 = ((lVar17 * local_308 + local_1d0 + local_2d0 * -8) * local_2b0 +
                                local_1c8 + local_2c8 * -8) * lVar29 + local_2c0 * -8 +
                               local_2b8 + local_2a8;
                      lVar17 = lVar13;
                      iVar25 = local_1b0;
                      do {
                        if (local_318[1] <= local_328[1]) {
                          lVar24 = (long)local_268.p +
                                   local_268.nstride * local_2f0 +
                                   (lVar12 - local_268.begin.y) * local_268.jstride * 8 +
                                   (lVar17 - local_268.begin.z) * local_268.kstride * 8 +
                                   (long)local_268.begin.x * -8 + local_2a8;
                          lVar23 = (long)local_228.p +
                                   local_228.nstride * local_2f0 +
                                   (lVar12 - local_228.begin.y) * local_228.jstride * 8 +
                                   (iVar25 - local_228.begin.z) * local_228.kstride * 8 +
                                   (long)local_228.begin.x * -8 + local_2a8;
                          lVar20 = lVar12;
                          lVar26 = lVar27;
                          lVar18 = lVar31;
                          do {
                            if (local_318[0] <= local_328[0]) {
                              lVar19 = 0;
                              do {
                                dVar1 = *(double *)(lVar26 + lVar19 * 8);
                                dVar2 = *(double *)(lVar18 + lVar19 * 8);
                                *(double *)(lVar23 + lVar19 * 8) =
                                     (1.0 - (dVar2 * local_168 + dVar1 * -0.5) /
                                            (dVar2 * dStack_160 + dVar1 * 0.5)) *
                                     *(double *)(lVar24 + lVar19 * 8) * local_198 +
                                     *(double *)(lVar23 + lVar19 * 8);
                                lVar19 = lVar19 + 1;
                              } while (iVar32 != (int)lVar19);
                            }
                            lVar20 = lVar20 + 1;
                            lVar24 = lVar24 + local_268.jstride * 8;
                            lVar18 = lVar18 + lVar29 * 8;
                            lVar26 = lVar26 + lVar29 * 8;
                            lVar23 = lVar23 + local_228.jstride * 8;
                          } while (local_2d8 != (int)lVar20);
                        }
                        lVar17 = lVar17 + 1;
                        lVar31 = lVar31 + lVar16;
                        lVar27 = lVar27 + lVar16;
                        iVar25 = iVar25 + 1;
                      } while (local_2e0 != (int)lVar17);
                    }
                  }
                  local_1e0 = local_1e0 + 1;
                  local_2f0 = local_2f0 + 8;
                  local_300 = local_300 + 0x18;
                  local_308 = local_308 + 0x18;
                  local_1d8 = lVar21;
                } while (local_1e0 != local_f8);
              }
              lVar17 = local_110;
              lVar12 = lVar30 + 1;
              local_1e8 = lVar30;
            } while (lVar30 + 1 != 3);
            MFIter::operator++(&local_90);
          } while (local_90.currentIndex < local_90.endIndex);
        }
        MFIter::~MFIter(&local_90);
        lVar17 = local_1a0 + 1;
      } while (lVar17 < (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels
              );
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::applyRobinBCTermsCoeffs ()
{
    if (!hasRobinBC()) return;

    const int ncomp = getNComp();
    bool reset_alpha = false;
    if (m_a_scalar == Real(0.0)) {
        m_a_scalar = Real(1.0);
        reset_alpha = true;
    }
    const Real bovera = m_b_scalar/m_a_scalar;

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        const int mglev = 0;
        const Box& domain = m_geom[amrlev][mglev].Domain();
        const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
        const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
        const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);

        if (reset_alpha) {
            m_a_coeffs[amrlev][mglev].setVal(0.0);
        }

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(m_a_coeffs[amrlev][mglev], mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx = mfi.validbox();
            Array4<Real> const& afab = m_a_coeffs[amrlev][mglev].array(mfi);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                Array4<Real const> const& bfab = m_b_coeffs[amrlev][mglev][idim].const_array(mfi);
                const Box& blo = amrex::adjCellLo(vbx,idim);
                const Box& bhi = amrex::adjCellHi(vbx,idim);
                bool outside_domain_lo = !(domain.contains(blo));
                bool outside_domain_hi = !(domain.contains(bhi));
                if ((!outside_domain_lo) && (!outside_domain_hi)) continue;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    Array4<Real const> const& rbc = (*m_robin_bcval[amrlev])[mfi].const_array(icomp*3);
                    if (m_lobc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_lo)
                    {
                        if (idim == 0) {
                            Real fac = bovera*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dxi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                afab(i+1,j,k,icomp) += fac*bfab(i+1,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else if (idim == 1) {
                            Real fac = bovera*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dyi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j+1,k,icomp) += fac*bfab(i,j+1,k,icomp)*(Real(1.0)-B);
                            });
                        } else {
                            Real fac = bovera*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dzi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j,k+1,icomp) += fac*bfab(i,j,k+1,icomp)*(Real(1.0)-B);
                            });
                        }
                    }
                    if (m_hibc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_hi)
                    {
                        if (idim == 0) {
                            Real fac = bovera*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dxi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                afab(i-1,j,k,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else if (idim == 1) {
                            Real fac = bovera*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dyi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j-1,k,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else {
                            Real fac = bovera*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dzi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j,k-1,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        }
                    }
                }
            }
        }
    }
}